

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

void __thiscall cppnet::Address::Address(Address *this,AddressType at)

{
  allocator local_15;
  AddressType local_14;
  Address *pAStack_10;
  AddressType at_local;
  Address *this_local;
  
  this->_address_type = at;
  local_14 = at;
  pAStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->_ip,"",&local_15);
  std::allocator<char>::~allocator((allocator<char> *)&local_15);
  this->_port = 0;
  return;
}

Assistant:

Address::Address(AddressType at):
    _address_type(at),    
    _ip(""),           
    _port(0) {
    
}